

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.h
# Opt level: O0

void __thiscall
yyml::nn::Variable<double>::Variable(Variable<double> *this,TensorShape *shape,string *name)

{
  function<void_()> local_b8;
  vector<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_> local_98;
  TensorShape local_80;
  TensorShape local_48;
  string *local_20;
  string *name_local;
  TensorShape *shape_local;
  Variable<double> *this_local;
  
  local_20 = name;
  name_local = (string *)shape;
  shape_local = (TensorShape *)this;
  TensorShape::TensorShape(&local_48,shape);
  Tensor<double>::Tensor(&this->values_,&local_48);
  TensorShape::~TensorShape(&local_48);
  TensorShape::TensorShape(&local_80,shape);
  Tensor<double>::Tensor(&this->grads_,&local_80);
  TensorShape::~TensorShape(&local_80);
  local_98.
  super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>::vector
            (&local_98);
  std::function<void_()>::function(&local_b8,(nullptr_t)0x0);
  Autograd<double>::Autograd(&this->autograd_,&local_98,this,&local_b8);
  std::function<void_()>::~function(&local_b8);
  std::vector<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>::~vector
            (&local_98);
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  return;
}

Assistant:

Variable(TensorShape shape, std::string name)
      : values_(shape),
        grads_(shape),
        autograd_({}, this, nullptr),
        name_(name) {}